

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

bool __thiscall wasm::Literal::isNaN(Literal *this)

{
  bool bVar1;
  int iVar2;
  float fVar3;
  undefined4 extraout_XMM0_Db;
  double __value;
  byte local_31;
  byte local_21;
  BasicType local_20 [2];
  Literal *local_18;
  Literal *this_local;
  
  local_20[1] = 4;
  local_18 = this;
  bVar1 = wasm::Type::operator==(&this->type,local_20 + 1);
  local_21 = 0;
  if (bVar1) {
    fVar3 = getf32(this);
    iVar2 = std::isnan((double)CONCAT44(extraout_XMM0_Db,fVar3));
    local_21 = (byte)iVar2;
  }
  if ((local_21 & 1) == 0) {
    local_20[0] = f64;
    bVar1 = wasm::Type::operator==(&this->type,local_20);
    local_31 = 0;
    if (bVar1) {
      __value = getf64(this);
      iVar2 = std::isnan(__value);
      local_31 = (byte)iVar2;
    }
    if ((local_31 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Literal::isNaN() {
  if (type == Type::f32 && std::isnan(getf32())) {
    return true;
  }
  if (type == Type::f64 && std::isnan(getf64())) {
    return true;
  }
  // TODO: SIMD?
  return false;
}